

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.hpp
# Opt level: O0

bool __thiscall BasicContainer::intersect(BasicContainer *this,Ray *ray,Hit *result)

{
  bool bVar1;
  void *in_RDX;
  float fVar2;
  point pVar3;
  vec3f vVar4;
  HitTmp HVar5;
  mat3x2f jacobi;
  point p;
  HitTmp tmp;
  vec2f *in_stack_fffffffffffffea0;
  vec3f *Ng;
  int k;
  vec3f *in_stack_fffffffffffffeb0;
  mat3x2f *this_00;
  point *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  float in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  treenode *in_stack_ffffffffffffff00;
  Ray *in_stack_ffffffffffffff08;
  BasicContainer *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff44;
  undefined1 local_a8 [72];
  point local_60;
  vec3f local_50;
  mat3x2f *local_40;
  float local_38;
  HitTmp local_30;
  void *local_20;
  bool local_1;
  
  local_20 = in_RDX;
  HVar5 = treehit(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  local_40 = (mat3x2f *)HVar5.primitive;
  local_38 = HVar5.t;
  local_30.primitive = (BasicPrimitive *)local_40;
  local_30.t = local_38;
  bVar1 = HitTmp::operator_cast_to_bool(&local_30);
  if (bVar1) {
    pVar3 = Ray::atParam((Ray *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         in_stack_fffffffffffffedc);
    fVar2 = pVar3.z;
    local_60._0_8_ = pVar3._0_8_;
    local_50.x = local_60.x;
    local_50.y = local_60.y;
    Ng = &local_50;
    local_60 = pVar3;
    local_50.z = fVar2;
    (*((local_30.primitive)->super_Primitive)._vptr_Primitive[4])();
    (*((local_30.primitive)->super_Primitive)._vptr_Primitive[5])(local_30.primitive,Ng);
    (*((local_30.primitive)->super_Primitive)._vptr_Primitive[6])(local_30.primitive,Ng);
    Primitive::Hit::Hit((Hit *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,Ng,
                        in_stack_fffffffffffffea0);
    k = (int)((ulong)Ng >> 0x20);
    memcpy(local_20,local_a8,0x48);
    this_00 = (mat3x2f *)local_30.primitive;
    if ((mat3x2f *)local_30.primitive != (mat3x2f *)0x0) {
      __dynamic_cast(local_30.primitive,&BasicPrimitive::typeinfo,&Triangle::typeinfo,0);
    }
    Triangle::jacobi((Triangle *)CONCAT44(in_stack_ffffffffffffff44,fVar2));
    vVar4 = mat3x2f::column(this_00,k);
    *(float *)((long)local_20 + 0x38) = vVar4.z;
    *(long *)((long)local_20 + 0x30) = vVar4._0_8_;
    vVar4 = mat3x2f::column(this_00,k);
    *(long *)((long)local_20 + 0x3c) = vVar4._0_8_;
    *(float *)((long)local_20 + 0x44) = vVar4.z;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool intersect(const Ray& ray, Hit* result) const override
	{
		HitTmp tmp = treehit(ray, root);
		if (!tmp) return false;
		point p = ray.atParam(tmp.t);
		*result = Hit(p, tmp.primitive->Ns(p), tmp.primitive->Ng(p), tmp.primitive->uv(p));
		auto jacobi = dynamic_cast<Triangle const*>(tmp.primitive)->jacobi();
		// TODO implement for other types of primitive
		result->dpdu = jacobi.column(0);
		result->dpdv = jacobi.column(1);
		return true;
	}